

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity
          (Vector<capnp::compiler::CompilerMain::OutputDirective> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x30)) {
    ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
              (&this->builder,(char *)newSize,lVar1 % 0x30);
  }
  newBuilder.ptr =
       kj::_::HeapArrayDisposer::
       allocateUninitialized<capnp::compiler::CompilerMain::OutputDirective>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::
  addAll<kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>>
            (&newBuilder,&this->builder);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=
            (&this->builder,&newBuilder);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }